

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_test_util_test.cc
# Opt level: O2

void anon_unknown.dwarf_4654::Test_TemplateTestUtilTest_GetIncludeAndSectionDictionaries::Run(void)

{
  TemplateString TVar1;
  TemplateString TVar2;
  TemplateString TVar3;
  TemplateString TVar4;
  TemplateString TVar5;
  TemplateString TVar6;
  TemplateString TVar7;
  TemplateString TVar8;
  TemplateString TVar9;
  TemplateString TVar10;
  TemplateString TVar11;
  TemplateString TVar12;
  TemplateString TVar13;
  TemplateString TVar14;
  TemplateString TVar15;
  TemplateString TVar16;
  TemplateString TVar17;
  TemplateString TVar18;
  int iVar19;
  byte *pbVar20;
  uint uVar21;
  char *pcVar22;
  char *pcVar23;
  TemplateDictionaryPeer peer_1;
  TemplateString local_338;
  vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
  dicts;
  TemplateDictionaryPeer peer;
  TemplateDictionaryPeer section_peer;
  TemplateDictionaryPeer include_peer;
  TemplateDictionaryPeer section_peer1;
  TemplateDictionaryPeer section_peer0;
  TemplateString local_2c0;
  TemplateString local_2a0;
  TemplateString local_280;
  TemplateString local_260;
  TemplateString local_240;
  TemplateString local_220;
  TemplateString local_200;
  TemplateString local_1e0;
  TemplateString local_1c0;
  TemplateString local_1a0;
  TemplateString local_180;
  TemplateString local_160;
  TemplateString local_140;
  TemplateString local_120;
  TemplateString local_100;
  TemplateString local_e0;
  TemplateString local_c0;
  TemplateString local_a0;
  TemplateDictionary dict;
  
  ctemplate::TemplateString::TemplateString(&local_338,"test_GetIncludeAndSectionDictionaries");
  ctemplate::TemplateDictionary::TemplateDictionary(&dict,&local_338,(UnsafeArena *)0x0);
  dicts.
  super__Vector_base<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  dicts.
  super__Vector_base<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  dicts.
  super__Vector_base<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  peer.dict_ = &dict;
  ctemplate::TemplateString::TemplateString(&local_338,"SECTION");
  iVar19 = ctemplate::TemplateDictionaryPeer::GetIncludeDictionaries(&peer,&local_338,&dicts);
  if (iVar19 == 0) {
    ctemplate::TemplateString::TemplateString(&local_338,"SECTION");
    iVar19 = ctemplate::TemplateDictionaryPeer::GetSectionDictionaries(&peer,&local_338,&dicts);
    if (iVar19 == 0) {
      std::
      _Vector_base<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
      ::~_Vector_base(&dicts.
                       super__Vector_base<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
                     );
      ctemplate::TemplateString::TemplateString(&local_a0,"SECTION");
      TVar1.length_ = local_a0.length_;
      TVar1.ptr_ = local_a0.ptr_;
      TVar1.is_immutable_ = local_a0.is_immutable_;
      TVar1._17_7_ = local_a0._17_7_;
      TVar1.id_ = local_a0.id_;
      ctemplate::TemplateDictionary::AddIncludeDictionary(TVar1);
      ctemplate::TemplateString::TemplateString(&local_c0,"SECTION_VALUE");
      ctemplate::TemplateString::TemplateString(&local_e0,"0");
      TVar2.length_ = local_c0.length_;
      TVar2.ptr_ = local_c0.ptr_;
      TVar2.is_immutable_ = local_c0.is_immutable_;
      TVar2._17_7_ = local_c0._17_7_;
      TVar2.id_ = local_c0.id_;
      TVar13.length_ = local_e0.length_;
      TVar13.ptr_ = local_e0.ptr_;
      TVar13.is_immutable_ = local_e0.is_immutable_;
      TVar13._17_7_ = local_e0._17_7_;
      TVar13.id_ = local_e0.id_;
      ctemplate::TemplateDictionary::SetValue(TVar2,TVar13);
      ctemplate::TemplateString::TemplateString(&local_100,"SECTION");
      TVar3.length_ = local_100.length_;
      TVar3.ptr_ = local_100.ptr_;
      TVar3.is_immutable_ = local_100.is_immutable_;
      TVar3._17_7_ = local_100._17_7_;
      TVar3.id_ = local_100.id_;
      ctemplate::TemplateDictionary::AddSectionDictionary(TVar3);
      ctemplate::TemplateString::TemplateString(&local_120,"SECTION_VALUE");
      ctemplate::TemplateString::TemplateString(&local_140,"1");
      TVar4.length_ = local_120.length_;
      TVar4.ptr_ = local_120.ptr_;
      TVar4.is_immutable_ = local_120.is_immutable_;
      TVar4._17_7_ = local_120._17_7_;
      TVar4.id_ = local_120.id_;
      TVar14.length_ = local_140.length_;
      TVar14.ptr_ = local_140.ptr_;
      TVar14.is_immutable_ = local_140.is_immutable_;
      TVar14._17_7_ = local_140._17_7_;
      TVar14.id_ = local_140.id_;
      ctemplate::TemplateDictionary::SetValue(TVar4,TVar14);
      dicts.
      super__Vector_base<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      dicts.
      super__Vector_base<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      dicts.
      super__Vector_base<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      peer_1.dict_ = &dict;
      ctemplate::TemplateString::TemplateString(&local_338,"SECTION");
      iVar19 = ctemplate::TemplateDictionaryPeer::GetIncludeDictionaries(&peer_1,&local_338,&dicts);
      if (iVar19 == 1) {
        include_peer.dict_ =
             *dicts.
              super__Vector_base<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
        ctemplate::TemplateString::TemplateString(&local_338,"SECTION_VALUE");
        pbVar20 = (byte *)ctemplate::TemplateDictionaryPeer::GetSectionValue
                                    (&include_peer,&local_338);
        uVar21 = *pbVar20 - 0x30;
        if (uVar21 == 0) {
          uVar21 = (uint)pbVar20[1];
        }
        if (uVar21 == 0) {
          peer.dict_ = (TemplateDictionary *)0x0;
          ctemplate::TemplateString::TemplateString(&local_338,"SECTION");
          iVar19 = ctemplate::TemplateDictionaryPeer::GetSectionDictionaries
                             (&peer_1,&local_338,
                              (vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
                               *)&peer);
          if (iVar19 != 1) {
            pcVar22 = "1";
LAB_00108db2:
            pcVar23 = "peer.GetSectionDictionaries(\"SECTION\", &section_dicts)";
            goto LAB_00108e4e;
          }
          section_peer.dict_ = *peer.dict_;
          ctemplate::TemplateString::TemplateString(&local_338,"SECTION_VALUE");
          pbVar20 = (byte *)ctemplate::TemplateDictionaryPeer::GetSectionValue
                                      (&section_peer,&local_338);
          uVar21 = *pbVar20 - 0x31;
          if (uVar21 == 0) {
            uVar21 = (uint)pbVar20[1];
          }
          if (uVar21 == 0) {
            std::
            _Vector_base<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
            ::~_Vector_base((_Vector_base<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
                             *)&peer);
            std::
            _Vector_base<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
            ::~_Vector_base(&dicts.
                             super__Vector_base<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
                           );
            ctemplate::TemplateString::TemplateString(&local_160,"SECTION");
            TVar5.length_ = local_160.length_;
            TVar5.ptr_ = local_160.ptr_;
            TVar5.is_immutable_ = local_160.is_immutable_;
            TVar5._17_7_ = local_160._17_7_;
            TVar5.id_ = local_160.id_;
            ctemplate::TemplateDictionary::AddIncludeDictionary(TVar5);
            ctemplate::TemplateString::TemplateString(&local_180,"SECTION_VALUE");
            ctemplate::TemplateString::TemplateString(&local_1a0,"2");
            TVar6.length_ = local_180.length_;
            TVar6.ptr_ = local_180.ptr_;
            TVar6.is_immutable_ = local_180.is_immutable_;
            TVar6._17_7_ = local_180._17_7_;
            TVar6.id_ = local_180.id_;
            TVar15.length_ = local_1a0.length_;
            TVar15.ptr_ = local_1a0.ptr_;
            TVar15.is_immutable_ = local_1a0.is_immutable_;
            TVar15._17_7_ = local_1a0._17_7_;
            TVar15.id_ = local_1a0.id_;
            ctemplate::TemplateDictionary::SetValue(TVar6,TVar15);
            ctemplate::TemplateString::TemplateString(&local_1c0,"ANOTHER_SECTION");
            TVar7.length_ = local_1c0.length_;
            TVar7.ptr_ = local_1c0.ptr_;
            TVar7.is_immutable_ = local_1c0.is_immutable_;
            TVar7._17_7_ = local_1c0._17_7_;
            TVar7.id_ = local_1c0.id_;
            ctemplate::TemplateDictionary::AddIncludeDictionary(TVar7);
            ctemplate::TemplateString::TemplateString(&local_1e0,"ANOTHER_VALUE");
            ctemplate::TemplateString::TemplateString(&local_200,"3");
            TVar8.length_ = local_1e0.length_;
            TVar8.ptr_ = local_1e0.ptr_;
            TVar8.is_immutable_ = local_1e0.is_immutable_;
            TVar8._17_7_ = local_1e0._17_7_;
            TVar8.id_ = local_1e0.id_;
            TVar16.length_ = local_200.length_;
            TVar16.ptr_ = local_200.ptr_;
            TVar16.is_immutable_ = local_200.is_immutable_;
            TVar16._17_7_ = local_200._17_7_;
            TVar16.id_ = local_200.id_;
            ctemplate::TemplateDictionary::SetValue(TVar8,TVar16);
            ctemplate::TemplateString::TemplateString(&local_220,"SECTION");
            TVar9.length_ = local_220.length_;
            TVar9.ptr_ = local_220.ptr_;
            TVar9.is_immutable_ = local_220.is_immutable_;
            TVar9._17_7_ = local_220._17_7_;
            TVar9.id_ = local_220.id_;
            ctemplate::TemplateDictionary::AddSectionDictionary(TVar9);
            ctemplate::TemplateString::TemplateString(&local_240,"SECTION_VALUE");
            ctemplate::TemplateString::TemplateString(&local_260,"4");
            TVar10.length_ = local_240.length_;
            TVar10.ptr_ = local_240.ptr_;
            TVar10.is_immutable_ = local_240.is_immutable_;
            TVar10._17_7_ = local_240._17_7_;
            TVar10.id_ = local_240.id_;
            TVar17.length_ = local_260.length_;
            TVar17.ptr_ = local_260.ptr_;
            TVar17.is_immutable_ = local_260.is_immutable_;
            TVar17._17_7_ = local_260._17_7_;
            TVar17.id_ = local_260.id_;
            ctemplate::TemplateDictionary::SetValue(TVar10,TVar17);
            ctemplate::TemplateString::TemplateString(&local_280,"ONE_MORE_SECTION");
            TVar11.length_ = local_280.length_;
            TVar11.ptr_ = local_280.ptr_;
            TVar11.is_immutable_ = local_280.is_immutable_;
            TVar11._17_7_ = local_280._17_7_;
            TVar11.id_ = local_280.id_;
            ctemplate::TemplateDictionary::AddSectionDictionary(TVar11);
            ctemplate::TemplateString::TemplateString(&local_2a0,"ANOTHER_VALUE");
            ctemplate::TemplateString::TemplateString(&local_2c0,"5");
            TVar12.length_ = local_2a0.length_;
            TVar12.ptr_ = local_2a0.ptr_;
            TVar12.is_immutable_ = local_2a0.is_immutable_;
            TVar12._17_7_ = local_2a0._17_7_;
            TVar12.id_ = local_2a0.id_;
            TVar18.length_ = local_2c0.length_;
            TVar18.ptr_ = local_2c0.ptr_;
            TVar18.is_immutable_ = local_2c0.is_immutable_;
            TVar18._17_7_ = local_2c0._17_7_;
            TVar18.id_ = local_2c0.id_;
            ctemplate::TemplateDictionary::SetValue(TVar12,TVar18);
            dicts.
            super__Vector_base<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            dicts.
            super__Vector_base<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            dicts.
            super__Vector_base<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            peer_1.dict_ = &dict;
            ctemplate::TemplateString::TemplateString(&local_338,"SECTION");
            iVar19 = ctemplate::TemplateDictionaryPeer::GetIncludeDictionaries
                               (&peer_1,&local_338,&dicts);
            if (iVar19 != 2) {
              pcVar22 = "2";
              goto LAB_00108cf7;
            }
            include_peer.dict_ =
                 *dicts.
                  super__Vector_base<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
            ctemplate::TemplateString::TemplateString(&local_338,"SECTION_VALUE");
            pbVar20 = (byte *)ctemplate::TemplateDictionaryPeer::GetSectionValue
                                        (&include_peer,&local_338);
            uVar21 = *pbVar20 - 0x30;
            if (uVar21 == 0) {
              uVar21 = (uint)pbVar20[1];
            }
            if (uVar21 == 0) {
              section_peer.dict_ =
                   dicts.
                   super__Vector_base<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[1];
              ctemplate::TemplateString::TemplateString(&local_338,"SECTION_VALUE");
              pbVar20 = (byte *)ctemplate::TemplateDictionaryPeer::GetSectionValue
                                          (&section_peer,&local_338);
              uVar21 = *pbVar20 - 0x32;
              if (uVar21 == 0) {
                uVar21 = (uint)pbVar20[1];
              }
              if (uVar21 == 0) {
                ctemplate::TemplateString::TemplateString(&local_338,"ANOTHER_SECTION");
                iVar19 = ctemplate::TemplateDictionaryPeer::GetIncludeDictionaries
                                   (&peer_1,&local_338,&dicts);
                if (iVar19 == 1) {
                  ctemplate::TemplateString::TemplateString(&local_338,"ONE_MORE_SECTION");
                  iVar19 = ctemplate::TemplateDictionaryPeer::GetIncludeDictionaries
                                     (&peer_1,&local_338,&dicts);
                  if (iVar19 == 0) {
                    peer.dict_ = (TemplateDictionary *)0x0;
                    ctemplate::TemplateString::TemplateString(&local_338,"SECTION");
                    iVar19 = ctemplate::TemplateDictionaryPeer::GetSectionDictionaries
                                       (&peer_1,&local_338,
                                        (vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
                                         *)&peer);
                    if (iVar19 != 2) {
                      pcVar22 = "2";
                      goto LAB_00108db2;
                    }
                    section_peer0.dict_ = *peer.dict_;
                    ctemplate::TemplateString::TemplateString(&local_338,"SECTION_VALUE");
                    pbVar20 = (byte *)ctemplate::TemplateDictionaryPeer::GetSectionValue
                                                (&section_peer0,&local_338);
                    uVar21 = *pbVar20 - 0x31;
                    if (uVar21 == 0) {
                      uVar21 = (uint)pbVar20[1];
                    }
                    if (uVar21 == 0) {
                      section_peer1.dict_ = peer.dict_[8];
                      ctemplate::TemplateString::TemplateString(&local_338,"SECTION_VALUE");
                      pbVar20 = (byte *)ctemplate::TemplateDictionaryPeer::GetSectionValue
                                                  (&section_peer1,&local_338);
                      uVar21 = *pbVar20 - 0x34;
                      if (uVar21 == 0) {
                        uVar21 = (uint)pbVar20[1];
                      }
                      if (uVar21 == 0) {
                        ctemplate::TemplateString::TemplateString(&local_338,"ANOTHER_SECTION");
                        iVar19 = ctemplate::TemplateDictionaryPeer::GetSectionDictionaries
                                           (&peer_1,&local_338,&dicts);
                        if (iVar19 == 0) {
                          ctemplate::TemplateString::TemplateString(&local_338,"ONE_MORE_SECTION");
                          iVar19 = ctemplate::TemplateDictionaryPeer::GetSectionDictionaries
                                             (&peer_1,&local_338,&dicts);
                          if (iVar19 == 1) {
                            std::
                            _Vector_base<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
                            ::~_Vector_base((_Vector_base<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
                                             *)&peer);
                            std::
                            _Vector_base<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
                            ::~_Vector_base(&dicts.
                                             super__Vector_base<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
                                           );
                            ctemplate::TemplateDictionary::~TemplateDictionary(&dict);
                            return;
                          }
                          pcVar22 = "1";
                          pcVar23 = "peer.GetSectionDictionaries(\"ONE_MORE_SECTION\", &dicts)";
                        }
                        else {
                          pcVar22 = "0";
                          pcVar23 = "peer.GetSectionDictionaries(\"ANOTHER_SECTION\", &dicts)";
                        }
                        goto LAB_00108e4e;
                      }
                      pcVar22 = 
                      "strcmp(\"4\", section_peer1.GetSectionValue(\"SECTION_VALUE\")) == 0";
                    }
                    else {
                      pcVar22 = 
                      "strcmp(\"1\", section_peer0.GetSectionValue(\"SECTION_VALUE\")) == 0";
                    }
                    goto LAB_00108df7;
                  }
                  pcVar22 = "0";
                  pcVar23 = "peer.GetIncludeDictionaries(\"ONE_MORE_SECTION\", &dicts)";
                }
                else {
                  pcVar22 = "1";
                  pcVar23 = "peer.GetIncludeDictionaries(\"ANOTHER_SECTION\", &dicts)";
                }
                goto LAB_00108e4e;
              }
              pcVar22 = "strcmp(\"2\", include_peer1.GetSectionValue(\"SECTION_VALUE\")) == 0";
            }
            else {
              pcVar22 = "strcmp(\"0\", include_peer0.GetSectionValue(\"SECTION_VALUE\")) == 0";
            }
          }
          else {
            pcVar22 = "strcmp(\"1\", section_peer.GetSectionValue(\"SECTION_VALUE\")) == 0";
          }
        }
        else {
          pcVar22 = "strcmp(\"0\", include_peer.GetSectionValue(\"SECTION_VALUE\")) == 0";
        }
LAB_00108df7:
        fprintf(_stderr,"Check failed: %s\n",pcVar22);
        goto LAB_00108e55;
      }
      pcVar22 = "1";
      pcVar23 = "peer.GetIncludeDictionaries(\"SECTION\", &include_dicts)";
    }
    else {
      pcVar22 = "0";
      pcVar23 = "peer.GetSectionDictionaries(\"SECTION\", &dicts)";
    }
  }
  else {
    pcVar22 = "0";
LAB_00108cf7:
    pcVar23 = "peer.GetIncludeDictionaries(\"SECTION\", &dicts)";
  }
LAB_00108e4e:
  fprintf(_stderr,"Check failed: %s %s %s\n",pcVar22,"==",pcVar23);
LAB_00108e55:
  exit(1);
}

Assistant:

TEST(TemplateTestUtilTest, GetIncludeAndSectionDictionaries) {
  TemplateDictionary dict("test_GetIncludeAndSectionDictionaries");

  {
    TemplateDictionaryPeer peer(&dict);
    vector<const TemplateDictionary*> dicts;
    EXPECT_EQ(0, peer.GetIncludeDictionaries("SECTION", &dicts));
    EXPECT_EQ(0, peer.GetSectionDictionaries("SECTION", &dicts));
  }

  dict.AddIncludeDictionary("SECTION")->SetValue("SECTION_VALUE", "0");
  dict.AddSectionDictionary("SECTION")->SetValue("SECTION_VALUE", "1");

  {
    TemplateDictionaryPeer peer(&dict);
    vector<const TemplateDictionary*> include_dicts;
    ASSERT_EQ(1, peer.GetIncludeDictionaries("SECTION", &include_dicts));

    TemplateDictionaryPeer include_peer(include_dicts[0]);
    EXPECT_STREQ("0", include_peer.GetSectionValue("SECTION_VALUE"));

    vector<const TemplateDictionary*> section_dicts;
    ASSERT_EQ(1, peer.GetSectionDictionaries("SECTION", &section_dicts));

    TemplateDictionaryPeer section_peer(section_dicts[0]);
    EXPECT_STREQ("1", section_peer.GetSectionValue("SECTION_VALUE"));
  }

  dict.AddIncludeDictionary("SECTION")->SetValue("SECTION_VALUE", "2");
  dict.AddIncludeDictionary("ANOTHER_SECTION")->SetValue("ANOTHER_VALUE", "3");

  dict.AddSectionDictionary("SECTION")->SetValue("SECTION_VALUE", "4");
  dict.AddSectionDictionary("ONE_MORE_SECTION")->SetValue("ANOTHER_VALUE", "5");

  {
    TemplateDictionaryPeer peer(&dict);
    vector<const TemplateDictionary*> dicts;
    ASSERT_EQ(2, peer.GetIncludeDictionaries("SECTION", &dicts));

    TemplateDictionaryPeer include_peer0(dicts[0]);
    EXPECT_STREQ("0", include_peer0.GetSectionValue("SECTION_VALUE"));

    TemplateDictionaryPeer include_peer1(dicts[1]);
    EXPECT_STREQ("2", include_peer1.GetSectionValue("SECTION_VALUE"));

    EXPECT_EQ(1, peer.GetIncludeDictionaries("ANOTHER_SECTION", &dicts));
    EXPECT_EQ(0, peer.GetIncludeDictionaries("ONE_MORE_SECTION", &dicts));

    vector<const TemplateDictionary*> section_dicts;
    ASSERT_EQ(2, peer.GetSectionDictionaries("SECTION", &section_dicts));

    TemplateDictionaryPeer section_peer0(section_dicts[0]);
    EXPECT_STREQ("1", section_peer0.GetSectionValue("SECTION_VALUE"));

    TemplateDictionaryPeer section_peer1(section_dicts[1]);
    EXPECT_STREQ("4", section_peer1.GetSectionValue("SECTION_VALUE"));

    EXPECT_EQ(0, peer.GetSectionDictionaries("ANOTHER_SECTION", &dicts));
    EXPECT_EQ(1, peer.GetSectionDictionaries("ONE_MORE_SECTION", &dicts));
  }
}